

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

S390CPU * cpu_s390_init(uc_struct_conflict14 *uc,char *cpu_model)

{
  S390CPU *cs;
  S390CPU *cpu;
  
  cs = (S390CPU *)calloc(1,0x92e0);
  if (cs == (S390CPU *)0x0) {
LAB_00cbc42b:
    cs = (S390CPU *)0x0;
  }
  else {
    if (uc->cpu_model == 0x7fffffff) {
      uc->cpu_model = 0x24;
    }
    else if (0x25 < uc->cpu_model) {
      free(cs);
      goto LAB_00cbc42b;
    }
    (cs->parent_obj).cc = &(cs->cc).parent_class;
    (cs->parent_obj).uc = (uc_struct_conflict7 *)uc;
    uc->cpu = (CPUState *)cs;
    cpu_class_init((uc_struct *)uc,&(cs->cc).parent_class);
    (cs->cc).reset = s390_cpu_reset;
    (cs->cc).parent_class.has_work = s390_cpu_has_work;
    (cs->cc).parent_class.set_pc = s390_cpu_set_pc;
    (cs->cc).parent_class.get_phys_page_debug = s390_cpu_get_phys_page_debug;
    (cs->cc).parent_class.cpu_exec_interrupt = s390_cpu_exec_interrupt;
    (cs->cc).parent_class.debug_excp_handler = s390x_cpu_debug_excp_handler;
    (cs->cc).parent_class.do_unaligned_access = s390x_cpu_do_unaligned_access;
    (cs->cc).parent_class.tcg_initialize = s390x_translate_init;
    (cs->cc).parent_class.tlb_fill_cpu = s390_cpu_tlb_fill;
    s390_skeys_init((uc_struct *)uc);
    s390_init_cpu_model((uc_struct *)uc,uc->cpu_model);
    cpu_common_initfn((uc_struct *)uc,(CPUState *)cs);
    (cs->parent_obj).env_ptr = &cs->env;
    (cs->parent_obj).icount_decr_ptr = &(cs->neg).icount_decr;
    (cs->parent_obj).halted = 1;
    (cs->parent_obj).exception_index = 0x10001;
    (cs->env).cpu_state = '\x01';
    (cs->env).uc = uc;
    (cs->parent_obj).cpu_index = (cs->env).core_id;
    cpu_exec_realizefn_s390x((CPUState *)cs);
    qemu_init_vcpu_s390x((CPUState *)cs);
    cpu_reset((CPUState *)cs);
    cpu_address_space_init_s390x((CPUState *)cs,0,(MemoryRegion_conflict *)(cs->parent_obj).memory);
  }
  return cs;
}

Assistant:

S390CPU *cpu_s390_init(struct uc_struct *uc, const char *cpu_model)
{
    S390CPU *cpu;
    CPUState *cs;
    CPUClass *cc;
    // int i;

    cpu = calloc(1, sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }

    if (uc->cpu_model == INT_MAX) {
        uc->cpu_model = UC_CPU_S390X_QEMU; // qemu-s390x-cpu
    } else if (uc->cpu_model > UC_CPU_S390X_MAX) {
        free(cpu);
        return NULL;
    }

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = (CPUState *)cpu;

    /* init CPUClass */
    cpu_class_init(uc, cc);

    /* init CPUClass */
    s390_cpu_class_init(uc, cc);

    // init skeys
    s390_skeys_init(uc);

    // init s390 models
    s390_init_cpu_model(uc, uc->cpu_model);

    /* init CPUState */
    cpu_common_initfn(uc, cs);

    /* init CPU */
    s390_cpu_initfn(uc, cs);

    /* realize CPU */
    s390_cpu_realizefn(uc, cs);

    // init addresss space
    cpu_address_space_init(cs, 0, cs->memory);

    //qemu_init_vcpu(cs);

    return cpu;
}